

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Https_proxy_client_connection::handle_output
          (Https_proxy_client_connection *this,bool *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  Reactor_base *pRVar4;
  size_t sz;
  bool *param_1_local;
  Https_proxy_client_connection *this_local;
  
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::length();
  (*(this->super_Connection).super_Event_handler._vptr_Event_handler[0xc])
            (&this->super_Connection,uVar1,uVar2);
  std::__cxx11::string::erase((ulong)&this->out_str,0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    pRVar4 = boost::scoped_ptr<iqnet::Reactor_base>::operator->(&this->reactor);
    (*pRVar4->_vptr_Reactor_base[3])(pRVar4,&this->super_Connection,2);
    pRVar4 = boost::scoped_ptr<iqnet::Reactor_base>::operator->(&this->reactor);
    (*pRVar4->_vptr_Reactor_base[2])(pRVar4,&this->super_Connection,1);
  }
  return;
}

Assistant:

void Https_proxy_client_connection::handle_output( bool& )
{
  size_t sz = send( out_str.c_str(), out_str.length() );
  out_str.erase( 0, sz );

  if( out_str.empty() )
  {
    reactor->unregister_handler( this, Reactor_base::OUTPUT );
    reactor->register_handler( this, Reactor_base::INPUT );
  }
}